

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::checkSpecialUnits(string *unit_string,uint64_t match_flags)

{
  bool bVar1;
  undefined8 uVar2;
  unit_data uVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__pos;
  bool bVar5;
  pointer pcVar6;
  precise_unit pVar7;
  string ustring;
  precise_unit bunit;
  pointer local_128;
  undefined1 local_120 [12];
  uint32_t uStack_114;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  precise_unit local_100;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  stack0xfffffffffffffee8 = local_120._0_8_;
  local_120._0_8_ = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"meter","");
  __pos = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)findWordOperatorSep(unit_string,(string *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
  }
  if (__pos != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xffffffffffffffff) {
    local_120._0_8_ = &local_110;
    pcVar6 = (unit_string->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_120,pcVar6,pcVar6 + unit_string->_M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
               (size_type)__pos,5);
    __pos = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)__pos;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_120._0_8_,
               (pointer)(local_120._0_8_ + stack0xfffffffffffffee8));
    local_100 = unit_from_string_internal(&local_f0,match_flags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != __pos) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_128 = (pointer)local_100.multiplier_;
    bVar1 = NAN(local_100.multiplier_);
    bVar5 = local_100.base_units_ != (unit_data)0xfa94a488;
    if (bVar5 || !bVar1) {
      uVar3 = detail::unit_data::operator*((unit_data *)(precise::m + 8),&local_100.base_units_);
      __pos = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_100.commodity_,uVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ != &local_110) {
      operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
    }
    if (bVar5 || !bVar1) goto LAB_003b55b9;
  }
  iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0
                  ,3,"amp");
  if (iVar4 == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,3,
               0xffffffffffffffff);
    _local_120 = unit_from_string_internal((string *)&local_d0,match_flags | 0x6000000000);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((unit_data)local_120._8_4_ != (unit_data)0xfa94a488 || !NAN((double)local_120._0_8_)) {
      local_128 = (pointer)local_120._0_8_;
      uVar3 = detail::unit_data::operator*
                        ((unit_data *)(precise::A + 8),(unit_data *)(local_120 + 8));
      __pos = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_114,uVar3);
      goto LAB_003b55b9;
    }
  }
  if (*(unit_string->_M_dataplus)._M_p == '%') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,1,
               0xffffffffffffffff);
    _local_120 = default_unit((string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((NAN((double)local_120._0_8_)) && ((unit_data)local_120._8_4_ == (unit_data)0xfa94a488)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,1,
                 0xffffffffffffffff);
      _local_120 = unit_from_string_internal((string *)&local_70,match_flags | 0x6000000000);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (!NAN((double)local_120._0_8_)) goto LAB_003b5408;
      bVar1 = true;
      if ((unit_data)local_120._8_4_ != (unit_data)0xfa94a488) goto LAB_003b5408;
    }
    else {
LAB_003b5408:
      local_100.base_units_ =
           detail::unit_data::operator*
                     ((unit_data *)(precise::percent + 8),(unit_data *)(precise::pu + 8));
      local_100.multiplier_ = 0.01;
      local_100.commodity_ = 0;
      uVar2 = local_120._0_8_;
      uVar3 = detail::unit_data::operator*(&local_100.base_units_,(unit_data *)(local_120 + 8));
      local_128 = (pointer)((double)uVar2 * 0.01);
      __pos = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_114 | local_100.commodity_,uVar3);
      bVar1 = false;
    }
    if (!bVar1) goto LAB_003b55b9;
  }
  iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0
                  ,2,"pu");
  if (iVar4 == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,2,
               0xffffffffffffffff);
    _local_120 = default_unit((string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = (pointer)local_120._0_8_;
    if ((NAN((double)local_120._0_8_)) && ((unit_data)local_120._8_4_ == (unit_data)0xfa94a488)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,2,
                 0xffffffffffffffff);
      _local_120 = unit_from_string_internal((string *)&local_b0,match_flags | 0x6000000000);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pcVar6 = (pointer)local_120._0_8_;
      if (!NAN((double)local_120._0_8_)) goto LAB_003b557a;
      bVar1 = true;
      if ((unit_data)local_120._8_4_ != (unit_data)0xfa94a488) goto LAB_003b557a;
    }
    else {
LAB_003b557a:
      uVar3 = detail::unit_data::operator*
                        ((unit_data *)(precise::pu + 8),(unit_data *)(local_120 + 8));
      __pos = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_114,uVar3);
      bVar1 = false;
      local_128 = pcVar6;
    }
    if (!bVar1) goto LAB_003b55b9;
  }
  __pos = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0xfa94a488;
  local_128 = (pointer)0x7ff4000000000000;
LAB_003b55b9:
  pVar7._8_8_ = __pos;
  pVar7.multiplier_ = (double)local_128;
  return pVar7;
}

Assistant:

static precise_unit
    checkSpecialUnits(const std::string& unit_string, std::uint64_t match_flags)
{
    // lets try checking for meter next which is one of the most common
    // reasons for getting here
    auto fnd = findWordOperatorSep(unit_string, "meter");
    if (fnd != std::string::npos) {
        std::string ustring = unit_string;
        ustring.erase(fnd, 5);
        auto bunit = unit_from_string_internal(ustring, match_flags);
        if (is_valid(bunit)) {
            return precise::m * bunit;
        }
    }
    // detect another somewhat common situation often amphour or ampsecond
    if (unit_string.compare(0, 3, "amp") == 0) {
        auto bunit = unit_from_string_internal(
            unit_string.substr(3), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::A * bunit;
        }
    }
    if (unit_string.front() == '%') {
        auto bunit = default_unit(unit_string.substr(1));
        if (is_valid(bunit)) {
            return precise::percent * precise::pu * bunit;
        }
        bunit = unit_from_string_internal(
            unit_string.substr(1), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::percent * precise::pu * bunit;
        }
    }
    if (unit_string.compare(0, 2, "pu") == 0) {
        auto bunit = default_unit(unit_string.substr(2));
        if (is_valid(bunit)) {
            return precise::pu * bunit;
        }
        bunit = unit_from_string_internal(
            unit_string.substr(2), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::pu * bunit;
        }
    }
    return precise::invalid;
}